

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

int Dam_ManUpdateNode(Dam_Man_t *p,int iObj,int iLit0,int iLit1,int iLitNew,Vec_Int_t *vDivs)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int local_58;
  uint local_54;
  int fPres;
  int iLit2;
  int iLit;
  int Num;
  int c;
  int k;
  int i;
  int *pSet;
  Vec_Int_t *vDivs_local;
  int iLitNew_local;
  int iLit1_local;
  int iLit0_local;
  int iObj_local;
  Dam_Man_t *p_local;
  
  piVar4 = Dam_ObjSet(p,iObj);
  for (c = 1; (c <= *piVar4 && (piVar4[c] != iLit0)); c = c + 1) {
  }
  if (*piVar4 < c) {
    p_local._4_4_ = 0;
  }
  else {
    for (c = 1; (c <= *piVar4 && (piVar4[c] != iLit1)); c = c + 1) {
    }
    if (*piVar4 < c) {
      p_local._4_4_ = 0;
    }
    else {
      Vec_IntPush(vDivs,-iObj);
      Num = 1;
      for (c = 1; c <= *piVar4; c = c + 1) {
        if ((iLit0 != piVar4[c]) && (iLit1 != piVar4[c])) {
          iVar3 = piVar4[c];
          iVar6 = Num + 1;
          piVar4[Num] = iVar3;
          local_54 = 0;
          for (iLit = 0; iLit < 2; iLit = iLit + 1) {
            local_58 = iLit0;
            if (iLit != 0) {
              local_58 = iLit1;
            }
            if (local_58 < iVar3 == iLit1 < iLit0) {
              piVar5 = Hash_Int2ManLookup(p->vHash,iVar3,local_58);
              iLit2 = *piVar5;
            }
            else {
              piVar5 = Hash_Int2ManLookup(p->vHash,local_58,iVar3);
              iLit2 = *piVar5;
            }
            if (0 < iLit2) {
              Vec_FltAddToEntry(p->vCounts,iLit2,-1.0);
              iVar2 = Vec_QueIsMember(p->vQue,iLit2);
              if (iVar2 != 0) {
                Vec_QueUpdate(p->vQue,iLit2);
                local_54 = 1 << ((byte)iLit & 0x1f) | local_54;
              }
            }
          }
          Num = iVar6;
          if (local_54 == 3) {
            if (iLitNew < iVar3 == iLit1 < iLit0) {
              iLit2 = Hash_Int2ManInsert(p->vHash,iVar3,iLitNew,0);
            }
            else {
              iLit2 = Hash_Int2ManInsert(p->vHash,iLitNew,iVar3,0);
            }
            Hash_Int2ObjInc(p->vHash,iLit2);
            Vec_IntPush(vDivs,iLit2);
            iVar3 = Vec_IntSize(p->vDivLevR);
            if (iVar3 <= iLit2) {
              pVVar1 = p->vDivLevR;
              iVar3 = Vec_IntSize(p->vDivLevR);
              Vec_IntFillExtra(pVVar1,(iVar3 * 3) / 2,0);
            }
            pVVar1 = p->vDivLevR;
            iVar3 = Vec_IntEntry(p->vNodLevR,iObj);
            Vec_IntUpdateEntry(pVVar1,iLit2,iVar3);
          }
        }
      }
      piVar4[Num] = iLitNew;
      *piVar4 = Num;
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Dam_ManUpdateNode( Dam_Man_t * p, int iObj, int iLit0, int iLit1, int iLitNew, Vec_Int_t * vDivs )
{
    int * pSet = Dam_ObjSet( p, iObj );
    int i, k, c, Num, iLit, iLit2, fPres;
    // check if literal can be found
    for ( i = 1; i <= pSet[0]; i++ )
        if ( pSet[i] == iLit0 )
            break;
    if ( i > pSet[0] )
        return 0;
    // check if literal can be found
    for ( i = 1; i <= pSet[0]; i++ )
        if ( pSet[i] == iLit1 )
            break;
    if ( i > pSet[0] )
        return 0;
    // compact literals
    Vec_IntPush( vDivs, -iObj );
    for ( k = i = 1; i <= pSet[0]; i++ )
    {
        if ( iLit0 == pSet[i] || iLit1 == pSet[i] )
            continue;
        pSet[k++] = iLit = pSet[i];
        // reduce weights of the divisors
        fPres = 0;
        for ( c = 0; c < 2; c++ )
        {
            iLit2 = c ? iLit1 : iLit0;
            if ( (iLit > iLit2) ^ (iLit0 > iLit1) )
                Num = *Hash_Int2ManLookup( p->vHash, iLit2, iLit );
            else
                Num = *Hash_Int2ManLookup( p->vHash, iLit, iLit2 );
            if ( Num > 0 )
            {
                Vec_FltAddToEntry( p->vCounts, Num, -1 );
                if ( Vec_QueIsMember(p->vQue, Num) )
                {
                    Vec_QueUpdate( p->vQue, Num );
                    fPres |= (1 << c);
                }
            }
        }
        if ( fPres != 3 )
            continue;
        if ( (iLit > iLitNew) ^ (iLit0 > iLit1) )
            Num = Hash_Int2ManInsert( p->vHash, iLitNew, iLit, 0 );
        else
            Num = Hash_Int2ManInsert( p->vHash, iLit, iLitNew, 0 );
        Hash_Int2ObjInc( p->vHash, Num );
        Vec_IntPush( vDivs, Num );
        // update reverse level
        if ( Num >= Vec_IntSize(p->vDivLevR) )
            Vec_IntFillExtra( p->vDivLevR, 3 * Vec_IntSize(p->vDivLevR) / 2, 0 );
        Vec_IntUpdateEntry( p->vDivLevR, Num, Vec_IntEntry(p->vNodLevR, iObj) );
    }
    pSet[k] = iLitNew;
    pSet[0] = k;
    return 1;
}